

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

VmConstant * ExtractValue(InstructionVMEvalContext *ctx,VmConstant *value,uint offset,VmType type)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  VmConstant *pVVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double *__src;
  ulong __n;
  VmValueType VVar5;
  
  if (value->sValue == (char *)0x0) {
    __assert_fail("value->sValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                  ,0x102,
                  "VmConstant *ExtractValue(InstructionVMEvalContext &, VmConstant *, unsigned int, VmType)"
                 );
  }
  __n = type._0_8_ >> 0x20;
  uVar1 = type.size;
  if ((value->super_VmValue).type.size < offset + uVar1) {
    __assert_fail("offset + type.size <= value->type.size",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                  ,0x103,
                  "VmConstant *ExtractValue(InstructionVMEvalContext &, VmConstant *, unsigned int, VmType)"
                 );
  }
  __src = (double *)(value->sValue + offset);
  VVar5 = type.type;
  if ((VVar5 == VM_TYPE_INT) && (uVar1 == 4)) {
    pVVar4 = CreateConstantInt(ctx->allocator,(SynBase *)0x0,*(int *)__src);
    return pVVar4;
  }
  if ((VVar5 == VM_TYPE_DOUBLE) && (uVar1 == 8)) {
    pVVar4 = CreateConstantDouble(ctx->allocator,(SynBase *)0x0,*__src);
    return pVVar4;
  }
  if ((VVar5 == VM_TYPE_LONG) && (uVar1 == 8)) {
    pVVar4 = CreateConstantLong(ctx->allocator,(SynBase *)0x0,(longlong)*__src);
    return pVVar4;
  }
  if (VVar5 != VM_TYPE_POINTER) {
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,__n);
    memcpy((char *)CONCAT44(extraout_var,iVar2),__src,__n);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
    pVVar4 = (VmConstant *)CONCAT44(extraout_var_00,iVar3);
    VmConstant::VmConstant(pVVar4,ctx->allocator,type,(SynBase *)0x0);
    pVVar4->sValue = (char *)CONCAT44(extraout_var,iVar2);
    return pVVar4;
  }
  if ((ulong)*__src >> 0x20 == 0) {
    pVVar4 = CreateConstantPointer
                       (ctx->allocator,(SynBase *)0x0,SUB84(*__src,0),(VariableData *)0x0,
                        type.structType,false);
    return pVVar4;
  }
  __assert_fail("unsigned(pointer) == pointer",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                ,0x128,
                "VmConstant *ExtractValue(InstructionVMEvalContext &, VmConstant *, unsigned int, VmType)"
               );
}

Assistant:

VmConstant* ExtractValue(InstructionVMEvalContext &ctx, VmConstant *value, unsigned offset, VmType type)
{
	assert(value->sValue);
	assert(offset + type.size <= value->type.size);

	const char *source = value->sValue + offset;

	if(type == VmType::Int)
	{
		int tmp = 0;
		memcpy(&tmp, source, sizeof(tmp));
		return CreateConstantInt(ctx.allocator, NULL, tmp);
	}
	else if(type == VmType::Double)
	{
		double tmp = 0;
		memcpy(&tmp, source, sizeof(tmp));
		return CreateConstantDouble(ctx.allocator, NULL, tmp);
	}
	else if(type == VmType::Long)
	{
		long long tmp = 0;
		memcpy(&tmp, source, sizeof(tmp));
		return CreateConstantLong(ctx.allocator, NULL, tmp);
	}
	else if(type.type == VM_TYPE_POINTER)
	{
		unsigned long long pointer = 0;

		if(sizeof(void*) == 4)
		{
			unsigned tmp;
			memcpy(&tmp, source, sizeof(void*));
			pointer = tmp;
		}
		else
		{
			memcpy(&pointer, source, sizeof(void*));
		}

		assert(unsigned(pointer) == pointer);

		return CreateConstantPointer(ctx.allocator, NULL, unsigned(pointer), NULL, type.structType, false);
	}
	else
	{
		char *tmp = (char*)ctx.allocator->alloc(type.size);
		memcpy(tmp, source, type.size);

		VmConstant *result = new (ctx.get<VmConstant>()) VmConstant(ctx.allocator, type, NULL);

		result->sValue = tmp;

		return result;
	}
}